

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::~SimpleGraphicsPipelineBuilder
          (SimpleGraphicsPipelineBuilder *this)

{
  Deleter<vk::Handle<(vk::HandleType)14>_> *this_00;
  long lVar1;
  
  this_00 = &this->m_shaderModules[5].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter;
  lVar1 = -0xc0;
  do {
    if (this_00[-1].m_allocator != (VkAllocationCallbacks *)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (this_00,(VkShaderModule)this_00[-1].m_allocator);
    }
    this_00->m_device = (VkDevice)0x0;
    this_00->m_allocator = (VkAllocationCallbacks *)0x0;
    this_00[-1].m_allocator = (VkAllocationCallbacks *)0x0;
    this_00->m_deviceIface = (DeviceInterface *)0x0;
    this_00 = (Deleter<vk::Handle<(vk::HandleType)14>_> *)&this_00[-2].m_allocator;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

~SimpleGraphicsPipelineBuilder	(void) { }